

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O3

void trico_decompress_double_precision(uint32_t *number_of_doubles,double **out,uint8_t *compressed)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  size_t __nmemb;
  void *__ptr;
  void *pvVar5;
  double *pdVar6;
  sbyte sVar7;
  sbyte sVar8;
  ulong *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong *puVar12;
  double **ppdVar13;
  ulong uVar14;
  double dVar15;
  double **ppdVar16;
  ulong uVar17;
  byte *pbVar18;
  double dVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  size_t __nmemb_00;
  void *__ptr_00;
  bool bVar24;
  uint64_t xor [2];
  uint64_t bcode [2];
  ulong local_118 [2];
  byte *local_108;
  double **local_100;
  ulong local_f8 [5];
  double local_d0;
  double *local_c8;
  uint local_bc;
  ulong local_b8;
  void *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar23;
  
  bVar2 = *compressed;
  uVar21 = bVar2 >> 3 & 0xfffffffe;
  uVar23 = (ulong)uVar21;
  uVar11 = (uint)bVar2 + (uint)bVar2 & 0x1e;
  local_b8 = (ulong)uVar11;
  sVar7 = (sbyte)uVar21;
  __nmemb = 1L << sVar7;
  __nmemb_00 = 1L << (sbyte)uVar11;
  uVar1 = __nmemb - 1;
  local_a8 = __nmemb_00 - 1;
  local_100 = out;
  __ptr = calloc(__nmemb,8);
  pvVar5 = calloc(__nmemb_00,8);
  bVar2 = compressed[1];
  *number_of_doubles = (uint)bVar2 << 0x18;
  uVar11 = (uint)compressed[2] << 0x10 | (uint)bVar2 << 0x18;
  *number_of_doubles = uVar11;
  uVar11 = (uint)compressed[3] << 8 | uVar11;
  *number_of_doubles = uVar11;
  local_108 = compressed + 5;
  local_bc = (uint)compressed[4];
  uVar11 = uVar11 | local_bc;
  *number_of_doubles = uVar11;
  pdVar6 = (double *)malloc((ulong)uVar11 * 8);
  *local_100 = pdVar6;
  uVar17 = 0;
  local_a0 = uVar1;
  local_b0 = pvVar5;
  if (uVar11 < 2) {
    local_f8[4] = 0;
    local_f8[2] = 0;
    uVar20 = 0;
    local_f8[3] = 0;
    local_d0 = 0.0;
    __ptr_00 = pvVar5;
  }
  else {
    local_68 = 0x40 - uVar23;
    local_70 = local_b8 >> 1 & 0x7fffffff;
    local_60 = 0x40 - local_b8;
    local_d0 = 0.0;
    local_f8[3] = 0;
    uVar20 = 0;
    local_f8[2] = 0;
    local_f8[4] = 0;
    local_98 = uVar23;
    local_50 = __ptr;
    local_58 = (ulong)(uVar11 >> 1);
    do {
      local_48 = uVar17;
      local_40 = uVar20;
      local_c8 = pdVar6;
      bVar2 = *local_108;
      local_38 = (ulong)bVar2;
      local_108 = local_108 + 1;
      iVar22 = 1;
      puVar12 = local_f8;
      sVar8 = 0;
      local_78 = local_118;
      do {
        local_100 = (double **)CONCAT44(local_100._4_4_,iVar22);
        uVar21 = bVar2 >> sVar8 & 0xf;
        *puVar12 = (ulong)uVar21;
        switch(uVar21) {
        case 0:
          *local_78 = 0;
          break;
        case 1:
          bVar3 = *local_108;
          local_108 = local_108 + 1;
          *local_78 = (ulong)bVar3;
          break;
        case 2:
          uVar20 = (ulong)*local_108 << 8;
          *local_78 = uVar20;
          bVar3 = local_108[1];
          local_108 = local_108 + 2;
          goto LAB_00112108;
        case 3:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x10;
          uVar20 = (ulong)((uint)local_108[1] << 8 | (uint)((ulong)bVar3 << 0x10));
          *local_78 = uVar20;
          pbVar18 = local_108 + 2;
          local_108 = local_108 + 3;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 4:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x18;
          uVar21 = (uint)local_108[1] << 0x10 | (uint)((ulong)bVar3 << 0x18);
          *local_78 = (ulong)uVar21;
          uVar20 = (ulong)((uint)local_108[2] << 8 | uVar21);
          *local_78 = uVar20;
          pbVar18 = local_108 + 3;
          local_108 = local_108 + 4;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 5:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x20;
          uVar20 = (ulong)local_108[1] << 0x18 | (ulong)bVar3 << 0x20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 4;
          local_108 = local_108 + 5;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 6:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x28;
          uVar20 = (ulong)local_108[1] << 0x20 | (ulong)bVar3 << 0x28;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x18 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[4] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 5;
          local_108 = local_108 + 6;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 7:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x30;
          uVar20 = (ulong)local_108[1] << 0x28 | (ulong)bVar3 << 0x30;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x20 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 0x18 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[4] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[5] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 6;
          local_108 = local_108 + 7;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 8:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x38;
          uVar20 = (ulong)local_108[1] << 0x30 | (ulong)bVar3 << 0x38;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x28 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 0x20 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[4] << 0x18 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[5] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[6] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 7;
          local_108 = local_108 + 8;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 9:
          bVar3 = *local_108;
          local_108 = local_108 + 1;
          *local_78 = (ulong)bVar3;
          break;
        case 10:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 8;
          pbVar18 = local_108 + 1;
          local_108 = local_108 + 2;
          *local_78 = (ulong)CONCAT11(bVar3,*pbVar18);
          break;
        case 0xb:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x10;
          uVar20 = (ulong)((uint)local_108[1] << 8 | (uint)((ulong)bVar3 << 0x10));
          *local_78 = uVar20;
          pbVar18 = local_108 + 2;
          local_108 = local_108 + 3;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 0xc:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x18;
          uVar21 = (uint)local_108[1] << 0x10 | (uint)((ulong)bVar3 << 0x18);
          *local_78 = (ulong)uVar21;
          uVar20 = (ulong)((uint)local_108[2] << 8 | uVar21);
          *local_78 = uVar20;
          pbVar18 = local_108 + 3;
          local_108 = local_108 + 4;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 0xd:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x20;
          uVar20 = (ulong)local_108[1] << 0x18 | (ulong)bVar3 << 0x20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 4;
          local_108 = local_108 + 5;
          *local_78 = *pbVar18 | uVar20;
          break;
        case 0xe:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x28;
          uVar20 = (ulong)local_108[1] << 0x20 | (ulong)bVar3 << 0x28;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x18 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[4] << 8 | uVar20;
          *local_78 = uVar20;
          bVar3 = local_108[5];
          local_108 = local_108 + 6;
LAB_00112108:
          *local_78 = bVar3 | uVar20;
          break;
        case 0xf:
          bVar3 = *local_108;
          *local_78 = (ulong)bVar3 << 0x30;
          uVar20 = (ulong)local_108[1] << 0x28 | (ulong)bVar3 << 0x30;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[2] << 0x20 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[3] << 0x18 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[4] << 0x10 | uVar20;
          *local_78 = uVar20;
          uVar20 = (ulong)local_108[5] << 8 | uVar20;
          *local_78 = uVar20;
          pbVar18 = local_108 + 6;
          local_108 = local_108 + 7;
          *local_78 = *pbVar18 | uVar20;
        }
        puVar12 = local_f8 + 1;
        sVar8 = 4;
        local_90 = local_118 + 1;
        local_88 = local_90;
        local_78 = local_90;
        local_80 = local_90;
        bVar24 = iVar22 != 0;
        iVar22 = 0;
      } while (bVar24);
      puVar12 = local_f8;
      puVar9 = local_118;
      uVar20 = local_40;
      pdVar6 = local_c8;
      bVar24 = true;
      do {
        bVar4 = bVar24;
        if (*puVar12 < 9) {
          local_f8[3] = local_f8[2];
        }
        dVar15 = (double)(local_f8[3] ^ *puVar9);
        *(double *)((long)__ptr + local_f8[4] * 8) = dVar15;
        *(long *)((long)pvVar5 + uVar20 * 8) = (long)dVar15 - (long)local_d0;
        local_f8[4] = (local_f8[4] << sVar7 ^ (ulong)dVar15 >> ((byte)(0x40 - uVar23) & 0x3f)) &
                      uVar1;
        local_f8[2] = *(ulong *)((long)__ptr + local_f8[4] * 8);
        uVar20 = (uVar20 << ((byte)local_70 & 0x3f) ^
                 (ulong)((long)dVar15 - (long)local_d0) >> ((byte)(0x40 - local_b8) & 0x3f)) &
                 local_a8;
        local_f8[3] = *(long *)((long)pvVar5 + uVar20 * 8) + (long)dVar15;
        *pdVar6 = dVar15;
        pdVar6 = pdVar6 + 1;
        puVar9 = local_118 + 1;
        puVar12 = local_f8 + 1;
        local_d0 = dVar15;
        bVar24 = false;
      } while (bVar4);
      uVar21 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar21;
      __ptr = local_50;
      uVar23 = local_98;
      __ptr_00 = local_b0;
    } while (uVar21 != uVar11 >> 1);
  }
  if ((local_bc & 1) == 0) goto LAB_0011264d;
  local_c8 = pdVar6;
  pbVar18 = local_108 + 1;
  ppdVar13 = (double **)0x2;
  uVar11 = *local_108 & 0xf;
  local_f8[0] = (ulong)uVar11;
  switch(uVar11) {
  case 0:
    local_118[0] = 0;
    goto LAB_0011289f;
  case 1:
    local_118[0] = (ulong)*pbVar18;
    ppdVar13 = (double **)0x2;
    if ((ulong)*pbVar18 == 0) {
      ppdVar13 = (double **)0x0;
    }
    goto LAB_0011289f;
  default:
    uVar17 = (ulong)*pbVar18 << 8;
    uVar14 = (ulong)local_108[2];
    break;
  case 3:
  case 0xb:
    uVar17 = (ulong)((uint)local_108[2] << 8 | (uint)*pbVar18 << 0x10);
    local_118[0] = (ulong)local_108[3];
    goto LAB_00112898;
  case 4:
  case 0xc:
    uVar17 = (ulong)((uint)local_108[3] << 8 | (uint)local_108[2] << 0x10 | (uint)*pbVar18 << 0x18);
    uVar14 = (ulong)local_108[4];
    break;
  case 5:
  case 0xd:
    uVar17 = (ulong)local_108[4] << 8 |
             (ulong)local_108[3] << 0x10 | (ulong)local_108[2] << 0x18 | (ulong)*pbVar18 << 0x20;
    local_118[0] = (ulong)local_108[5];
    goto LAB_00112898;
  case 6:
  case 0xe:
    uVar17 = (ulong)local_108[5] << 8 |
             (ulong)local_108[4] << 0x10 |
             (ulong)local_108[3] << 0x18 | (ulong)local_108[2] << 0x20 | (ulong)*pbVar18 << 0x28;
    uVar14 = (ulong)local_108[6];
    break;
  case 7:
  case 0xf:
    uVar17 = (ulong)local_108[6] << 8 |
             (ulong)local_108[5] << 0x10 |
             (ulong)local_108[4] << 0x18 |
             (ulong)local_108[3] << 0x20 | (ulong)local_108[2] << 0x28 | (ulong)*pbVar18 << 0x30;
    local_118[0] = (ulong)local_108[7];
LAB_00112898:
    local_118[0] = local_118[0] | uVar17;
LAB_0011289b:
    goto LAB_0011289f;
  case 8:
    uVar17 = (ulong)local_108[7] << 8 |
             (ulong)local_108[6] << 0x10 |
             (ulong)local_108[5] << 0x18 |
             (ulong)local_108[4] << 0x20 |
             (ulong)local_108[3] << 0x28 | (ulong)local_108[2] << 0x30 | (ulong)*pbVar18 << 0x38;
    uVar14 = (ulong)local_108[8];
    break;
  case 9:
    local_118[0] = (ulong)*pbVar18;
    goto LAB_0011289b;
  }
  local_118[0] = uVar14 | uVar17;
LAB_0011289f:
  if (1 < (uint)ppdVar13) {
    local_f8[1] = (ulong)(*local_108 >> 4);
    (*(code *)((long)&switchD_0011258c::switchdataD_0011aae4 +
              (long)(int)(&switchD_0011258c::switchdataD_0011aae4)[local_f8[1]]))();
    return;
  }
  __ptr_00 = pvVar5;
  if ((uint)ppdVar13 != 0) {
    local_100 = ppdVar13;
    ppdVar16 = (double **)0x0;
    uVar17 = local_f8[2];
    dVar15 = local_d0;
    uVar14 = local_f8[4];
    uVar10 = local_f8[3];
    do {
      if (local_f8[(long)ppdVar16] < 9) {
        uVar10 = uVar17;
      }
      dVar19 = (double)(uVar10 ^ local_118[(long)ppdVar16]);
      *(double *)((long)__ptr + uVar14 * 8) = dVar19;
      uVar14 = ((ulong)dVar19 >> (0x40U - (sbyte)uVar23 & 0x3f) ^ uVar14 << (sbyte)uVar23) & uVar1;
      *(long *)((long)pvVar5 + uVar20 * 8) = (long)dVar19 - (long)dVar15;
      uVar17 = *(ulong *)((long)__ptr + uVar14 * 8);
      uVar20 = ((ulong)((long)dVar19 - (long)dVar15) >> (0x40U - (char)local_b8 & 0x3f) ^
               uVar20 << ((byte)(local_b8 >> 1) & 0x3f)) & local_a8;
      uVar10 = *(long *)((long)pvVar5 + uVar20 * 8) + (long)dVar19;
      pdVar6[(long)ppdVar16] = dVar19;
      ppdVar16 = (double **)((long)ppdVar16 + 1);
      dVar15 = dVar19;
    } while (ppdVar13 != ppdVar16);
  }
LAB_0011264d:
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trico_decompress_double_precision(uint32_t* number_of_doubles, double** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint64_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint64_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint64_t hash1_size = (uint64_t)1 << hash1_size_exponent;
  const uint64_t hash2_size = (uint64_t)1 << hash2_size_exponent;
  const uint64_t hash1_mask = hash1_size - 1;
  const uint64_t hash2_mask = hash2_size - 1;

  uint64_t* hash_table_1 = (uint64_t*)trico_calloc(hash1_size, 8);
  uint64_t* hash_table_2 = (uint64_t*)trico_calloc(hash2_size, 8);

  *number_of_doubles = ((uint32_t)(*compressed++)) << 24;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 16;
  *number_of_doubles |= ((uint32_t)(*compressed++)) << 8;
  *number_of_doubles |= ((uint32_t)(*compressed++));
  *out = (double*)trico_malloc(*number_of_doubles * sizeof(double));

  uint64_t bc;
  uint64_t bcode[2];
  uint64_t xor[2];
  uint64_t value;
  uint64_t hash1 = 0;
  uint64_t prediction1 = 0;
  uint64_t hash2 = 0;
  uint64_t prediction2 = 0;
  uint64_t stride;
  uint64_t last_value = 0;
  uint64_t* p_out = (uint64_t*)(*out);

  const uint32_t cnt = *number_of_doubles / 2;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++));
    for (int j = 0; j < 2; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 2; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_doubles & 1)
    {
    bc = ((uint32_t)(*compressed++));
    int max_j = 2;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 4)) & 15;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint64_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 8:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 56;
        xor[j] |= ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 9:
        {
        xor[j] = ((uint64_t)(*compressed++));
        break;
        }
        case 10:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 11:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 12:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 13:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 14:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        case 15:
        {
        xor[j] = ((uint64_t)(*compressed++)) << 48;
        xor[j] |= ((uint64_t)(*compressed++)) << 40;
        xor[j] |= ((uint64_t)(*compressed++)) << 32;
        xor[j] |= ((uint64_t)(*compressed++)) << 24;
        xor[j] |= ((uint64_t)(*compressed++)) << 16;
        xor[j] |= ((uint64_t)(*compressed++)) << 8;
        xor[j] |= ((uint64_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 8)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_64(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_64(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }